

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O3

FileFormat InferFileFormat(string *filepath,FileFormat defaultFormat)

{
  _Base_ptr p_Var1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ending;
  _Base_ptr p_Var6;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  
  lVar4 = std::__cxx11::string::find_last_of((char *)filepath,0x1820a6,0xffffffffffffffff);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)filepath);
    p_Var5 = FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar2 = defaultFormat;
    if ((_Rb_tree_header *)
        FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      do {
        ext.field_2._12_4_ = uVar2;
        p_Var1 = p_Var5[1]._M_left;
        for (p_Var6 = p_Var5[1]._M_parent; p_Var6 != p_Var1; p_Var6 = p_Var6 + 1) {
          if (((_Base_ptr)ext._M_dataplus._M_p == p_Var6->_M_parent) &&
             ((ext._M_dataplus._M_p == (pointer)0x0 ||
              (iVar3 = bcmp(local_58,*(void **)p_Var6,(size_t)ext._M_dataplus._M_p), iVar3 == 0))))
          {
            defaultFormat = p_Var5[1]._M_color;
            goto LAB_00161f61;
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        defaultFormat = ext.field_2._12_4_;
        uVar2 = ext.field_2._12_4_;
      } while ((_Rb_tree_header *)p_Var5 !=
               &FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
    }
LAB_00161f61:
    if ((size_type *)local_58 != &ext._M_string_length) {
      operator_delete(local_58);
    }
  }
  return defaultFormat;
}

Assistant:

static FileFormat InferFileFormat( const std::string& filepath, const FileFormat defaultFormat ) {
  auto pos = filepath.find_last_of( "." );
  if( pos == std::string::npos )
    return defaultFormat;

  auto ext = filepath.substr( pos + 1 );
  for( auto &ff : FileFormatEndings ) {
    for( auto &ending : ff.second ) {
      if( ext == ending )
        return ff.first;
    }
  }
  return defaultFormat;
}